

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O1

int db_getinfo(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_State *L1;
  char *pcVar3;
  lua_Integer lVar4;
  char *pcVar5;
  int idx;
  int arg;
  lua_Debug ar;
  int local_b4;
  lua_Debug local_b0;
  
  L1 = getthread(L,&local_b4);
  iVar2 = local_b4 + 2;
  pcVar3 = luaL_optlstring(L,iVar2,"flnSrtu",(size_t *)0x0);
  checkstack(L,L1,3);
  if (*pcVar3 == '>') {
    luaL_argerror(L,iVar2,"invalid option \'>\'");
  }
  idx = local_b4 + 1;
  iVar1 = lua_type(L,idx);
  if (iVar1 == 6) {
    pcVar3 = lua_pushfstring(L,">%s",pcVar3);
    lua_pushvalue(L,idx);
    lua_xmove(L,L1,1);
  }
  else {
    lVar4 = luaL_checkinteger(L,idx);
    iVar1 = lua_getstack(L1,(int)lVar4,&local_b0);
    if (iVar1 == 0) {
      lua_pushnil(L);
      return 1;
    }
  }
  iVar1 = lua_getinfo(L1,pcVar3,&local_b0);
  if (iVar1 == 0) {
    iVar2 = luaL_argerror(L,iVar2,"invalid option");
  }
  else {
    lua_createtable(L,0,0);
    pcVar5 = strchr(pcVar3,0x53);
    if (pcVar5 != (char *)0x0) {
      lua_pushlstring(L,local_b0.source,local_b0.srclen);
      lua_setfield(L,-2,"source");
      lua_pushstring(L,local_b0.short_src);
      lua_setfield(L,-2,"short_src");
      lua_pushinteger(L,(long)local_b0.linedefined);
      lua_setfield(L,-2,"linedefined");
      lua_pushinteger(L,(long)local_b0.lastlinedefined);
      lua_setfield(L,-2,"lastlinedefined");
      lua_pushstring(L,local_b0.what);
      lua_setfield(L,-2,"what");
    }
    pcVar5 = strchr(pcVar3,0x6c);
    if (pcVar5 != (char *)0x0) {
      lua_pushinteger(L,(long)local_b0.currentline);
      lua_setfield(L,-2,"currentline");
    }
    pcVar5 = strchr(pcVar3,0x75);
    if (pcVar5 != (char *)0x0) {
      lua_pushinteger(L,(ulong)local_b0.nups);
      lua_setfield(L,-2,"nups");
      lua_pushinteger(L,(ulong)local_b0.nparams);
      lua_setfield(L,-2,"nparams");
      lua_pushboolean(L,(int)local_b0.isvararg);
      lua_setfield(L,-2,"isvararg");
    }
    pcVar5 = strchr(pcVar3,0x6e);
    if (pcVar5 != (char *)0x0) {
      lua_pushstring(L,local_b0.name);
      lua_setfield(L,-2,"name");
      lua_pushstring(L,local_b0.namewhat);
      lua_setfield(L,-2,"namewhat");
    }
    pcVar5 = strchr(pcVar3,0x72);
    if (pcVar5 != (char *)0x0) {
      lua_pushinteger(L,(ulong)local_b0.ftransfer);
      lua_setfield(L,-2,"ftransfer");
      lua_pushinteger(L,(ulong)local_b0.ntransfer);
      lua_setfield(L,-2,"ntransfer");
    }
    pcVar5 = strchr(pcVar3,0x74);
    if (pcVar5 != (char *)0x0) {
      lua_pushboolean(L,(int)local_b0.istailcall);
      lua_setfield(L,-2,"istailcall");
    }
    pcVar5 = strchr(pcVar3,0x4c);
    if (pcVar5 != (char *)0x0) {
      treatstackoption(L,L1,"activelines");
    }
    pcVar3 = strchr(pcVar3,0x66);
    iVar2 = 1;
    if (pcVar3 != (char *)0x0) {
      treatstackoption(L,L1,"func");
    }
  }
  return iVar2;
}

Assistant:

static int db_getinfo (lua_State *L) {
  lua_Debug ar;
  int arg;
  lua_State *L1 = getthread(L, &arg);
  const char *options = luaL_optstring(L, arg+2, "flnSrtu");
  checkstack(L, L1, 3);
  luaL_argcheck(L, options[0] != '>', arg + 2, "invalid option '>'");
  if (lua_isfunction(L, arg + 1)) {  /* info about a function? */
    options = lua_pushfstring(L, ">%s", options);  /* add '>' to 'options' */
    lua_pushvalue(L, arg + 1);  /* move function to 'L1' stack */
    lua_xmove(L, L1, 1);
  }
  else {  /* stack level */
    if (!lua_getstack(L1, (int)luaL_checkinteger(L, arg + 1), &ar)) {
      luaL_pushfail(L);  /* level out of range */
      return 1;
    }
  }
  if (!lua_getinfo(L1, options, &ar))
    return luaL_argerror(L, arg+2, "invalid option");
  lua_newtable(L);  /* table to collect results */
  if (strchr(options, 'S')) {
    lua_pushlstring(L, ar.source, ar.srclen);
    lua_setfield(L, -2, "source");
    settabss(L, "short_src", ar.short_src);
    settabsi(L, "linedefined", ar.linedefined);
    settabsi(L, "lastlinedefined", ar.lastlinedefined);
    settabss(L, "what", ar.what);
  }
  if (strchr(options, 'l'))
    settabsi(L, "currentline", ar.currentline);
  if (strchr(options, 'u')) {
    settabsi(L, "nups", ar.nups);
    settabsi(L, "nparams", ar.nparams);
    settabsb(L, "isvararg", ar.isvararg);
  }
  if (strchr(options, 'n')) {
    settabss(L, "name", ar.name);
    settabss(L, "namewhat", ar.namewhat);
  }
  if (strchr(options, 'r')) {
    settabsi(L, "ftransfer", ar.ftransfer);
    settabsi(L, "ntransfer", ar.ntransfer);
  }
  if (strchr(options, 't'))
    settabsb(L, "istailcall", ar.istailcall);
  if (strchr(options, 'L'))
    treatstackoption(L, L1, "activelines");
  if (strchr(options, 'f'))
    treatstackoption(L, L1, "func");
  return 1;  /* return table */
}